

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

reference __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::operator()
          (View<int,false,std::allocator<unsigned_long>> *this,size_t value,int args,int args_1,
          int args_2)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  bool assertion;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (*(long *)this == 0) {
    assertion = false;
  }
  else {
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    assertion = sVar2 == 4;
  }
  marray_detail::Assert<bool>(assertion);
  lVar1 = *(long *)this;
  sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
  sVar3 = elementAccessHelper<int,int>(this,4,(long)args,args_1,args_2);
  return (reference)(lVar1 + sVar2 * value * 4 + sVar3 * 4);
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value, 
    const Args... args
) const
{
    testInvariant();
    marray_detail::Assert( MARRAY_NO_DEBUG || ( data_ != 0 && sizeof...(args)+1 == dimension() ) );
    return data_[ strides(0) * static_cast<std::size_t>(value) 
        + static_cast<std::size_t>(elementAccessHelper(sizeof...(args)+1, args...)) ];
}